

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layer.cpp
# Opt level: O0

int __thiscall ncnn::Layer::forward(Layer *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  bool bVar1;
  int in_ECX;
  undefined4 in_register_0000000c;
  undefined8 in_RDX;
  __fn *in_RSI;
  Mat *in_RDI;
  void *in_R8;
  undefined8 in_R9;
  Mat *in_stack_ffffffffffffff88;
  Mat local_68;
  long local_28;
  undefined8 local_20;
  int local_4;
  
  local_28 = CONCAT44(in_register_0000000c,in_ECX);
  if (((ulong)in_RDI->refcount & 0x100) == 0) {
    local_4 = -1;
  }
  else {
    local_20 = in_RDX;
    Mat::clone(&local_68,in_RSI,*(void **)(local_28 + 8),in_ECX,in_R8,in_R9,&local_68);
    Mat::operator=(in_stack_ffffffffffffff88,in_RDI);
    Mat::~Mat((Mat *)0x1199f1);
    bVar1 = Mat::empty(in_RDI);
    if (bVar1) {
      local_4 = -100;
    }
    else {
      local_4 = (**(code **)((long)in_RDI->data + 0x48))(in_RDI,local_20,local_28);
    }
  }
  return local_4;
}

Assistant:

int Layer::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    if (!support_inplace)
        return -1;

    top_blob = bottom_blob.clone(opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    return forward_inplace(top_blob, opt);
}